

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.h
# Opt level: O3

void __thiscall
Js::AsmJsModuleInfo::SetFunctionTable(AsmJsModuleInfo *this,int i,ModuleFunctionTable *var)

{
  ModuleFunctionTable *pMVar1;
  uint *puVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *addr;
  
  if (this->mFunctionTableCount <= i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsModule.h"
                                ,0x1c2,"(i < mFunctionTableCount)","i < mFunctionTableCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pMVar1 = (this->mFunctionTables).ptr + i;
  addr = &pMVar1->moduleFunctionIndex;
  pMVar1->size = var->size;
  puVar2 = (var->moduleFunctionIndex).ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = puVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void SetFunctionTable(int i, ModuleFunctionTable var)
        {
            Assert(i < mFunctionTableCount);
            mFunctionTables[i] = var;
        }